

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omptarget.cpp
# Opt level: O2

int target_data_end(DeviceTy *Device,int32_t arg_num,void **args_base,void **args,int64_t *arg_sizes
                   ,int64_t *arg_types)

{
  undefined8 *puVar1;
  ulong uVar2;
  undefined8 *puVar3;
  byte bVar4;
  int32_t iVar5;
  int iVar6;
  void *TgtPtrBegin;
  iterator __position;
  long lVar7;
  byte bVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  undefined8 *HstPtrBegin;
  bool bVar12;
  bool IsLast;
  DeviceTy *local_80;
  int64_t *local_78;
  int64_t local_70;
  int local_64;
  pthread_mutex_t *local_60;
  void **local_58;
  void *local_50;
  int64_t *local_48;
  ulong local_40;
  _Rb_tree<void*,std::pair<void*const,ShadowPtrValTy>,std::_Select1st<std::pair<void*const,ShadowPtrValTy>>,std::less<void*>,std::allocator<std::pair<void*const,ShadowPtrValTy>>>
  *local_38;
  
  local_60 = (pthread_mutex_t *)&Device->ShadowMtx;
  local_38 = (_Rb_tree<void*,std::pair<void*const,ShadowPtrValTy>,std::_Select1st<std::pair<void*const,ShadowPtrValTy>>,std::less<void*>,std::allocator<std::pair<void*const,ShadowPtrValTy>>>
              *)&Device->ShadowPtrMap;
  local_40 = (ulong)(uint)arg_num;
  local_80 = Device;
  local_78 = arg_types;
  local_64 = arg_num;
  local_58 = args;
  local_48 = arg_sizes;
  do {
    do {
      do {
        uVar9 = local_40;
        iVar10 = (int)uVar9;
        if (iVar10 < 1) goto LAB_00106e4a;
        local_40 = uVar9 - 1;
        uVar2 = local_78[uVar9 - 1];
      } while ((uVar2 & 0x180) != 0);
      HstPtrBegin = (undefined8 *)local_58[uVar9 - 1];
      local_70 = local_48[uVar9 - 1];
      if (((iVar10 < local_64 && uVar2 < 0x1000000000000) &&
          (uVar9 == *(ushort *)((long)local_78 + uVar9 * 8 + 6))) &&
         (lVar7 = (long)HstPtrBegin % 8, lVar7 != 0)) {
        HstPtrBegin = (undefined8 *)((long)HstPtrBegin - lVar7);
        local_70 = local_70 + lVar7;
      }
      uVar11 = (uint)uVar2;
      TgtPtrBegin = DeviceTy::getTgtPtrBegin
                              (local_80,HstPtrBegin,local_70,&IsLast,
                               (bool)((byte)((uVar11 & 0x10) >> 4) | uVar2 < 0x1000000000000));
      uVar2 = local_78[uVar9 - 1];
      bVar4 = (byte)(((uint)uVar2 & 0x10) >> 4) | uVar2 < 0x1000000000000;
      bVar8 = ((byte)((uVar11 & 8) >> 3) | IsLast) & bVar4;
    } while (((uVar2 & 2) == 0) && (bVar8 == 0));
    if ((uVar2 & 2) != 0) {
      if (bVar4 == 0) {
        local_50 = TgtPtrBegin;
        lVar7 = DeviceTy::getMapEntryRefCnt(local_80,local_58[(ushort)(uVar2 >> 0x30) - 1]);
        bVar12 = lVar7 == 1;
        TgtPtrBegin = local_50;
      }
      else {
        bVar12 = false;
      }
      if (((byte)((byte)(((uint)uVar2 & 4) >> 2) | bVar12 | bVar8) == 1) &&
         (iVar5 = DeviceTy::data_retrieve(local_80,HstPtrBegin,TgtPtrBegin,local_70), iVar5 != 0))
      break;
    }
    puVar1 = (undefined8 *)(local_70 + (long)HstPtrBegin);
    std::mutex::lock((mutex *)&local_60->__data);
    __position._M_node =
         (local_80->ShadowPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)__position._M_node !=
           &(Device->ShadowPtrMap)._M_t._M_impl.super__Rb_tree_header) {
      puVar3 = *(undefined8 **)(__position._M_node + 1);
      if (puVar3 < HstPtrBegin) {
LAB_00106e06:
        __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      }
      else {
        if (puVar1 <= puVar3) break;
        if ((*(byte *)(local_78 + (uVar9 - 1)) & 2) != 0) {
          *puVar3 = __position._M_node[1]._M_parent;
        }
        if (bVar8 == 0) goto LAB_00106e06;
        __position = std::
                     _Rb_tree<void*,std::pair<void*const,ShadowPtrValTy>,std::_Select1st<std::pair<void*const,ShadowPtrValTy>>,std::less<void*>,std::allocator<std::pair<void*const,ShadowPtrValTy>>>
                     ::erase_abi_cxx11_(local_38,__position);
      }
    }
    pthread_mutex_unlock(local_60);
  } while ((bVar8 == 0) ||
          (iVar6 = DeviceTy::deallocTgtPtr(local_80,HstPtrBegin,local_70,SUB41((uVar11 & 8) >> 3,0))
          , iVar6 == 0));
LAB_00106e4a:
  return -(uint)(0 < iVar10);
}

Assistant:

int target_data_end(DeviceTy &Device, int32_t arg_num, void **args_base,
    void **args, int64_t *arg_sizes, int64_t *arg_types) {
  // process each input.
  for (int32_t i = arg_num - 1; i >= 0; --i) {
    // Ignore private variables and arrays - there is no mapping for them.
    // Also, ignore the use_device_ptr directive, it has no effect here.
    if ((arg_types[i] & OMP_TGT_MAPTYPE_LITERAL) ||
        (arg_types[i] & OMP_TGT_MAPTYPE_PRIVATE))
      continue;

    void *HstPtrBegin = args[i];
    int64_t data_size = arg_sizes[i];
    // Adjust for proper alignment if this is a combined entry (for structs).
    // Look at the next argument - if that is MEMBER_OF this one, then this one
    // is a combined entry.
    int64_t padding = 0;
    const int next_i = i+1;
    if (member_of(arg_types[i]) < 0 && next_i < arg_num &&
        member_of(arg_types[next_i]) == i) {
      padding = (int64_t)HstPtrBegin % alignment;
      if (padding) {
        DP("Using a padding of %" PRId64 " bytes for begin address " DPxMOD
            "\n", padding, DPxPTR(HstPtrBegin));
        HstPtrBegin = (char *) HstPtrBegin - padding;
        data_size += padding;
      }
    }

    bool IsLast;
    bool UpdateRef = !(arg_types[i] & OMP_TGT_MAPTYPE_MEMBER_OF) ||
        (arg_types[i] & OMP_TGT_MAPTYPE_PTR_AND_OBJ);
    bool ForceDelete = arg_types[i] & OMP_TGT_MAPTYPE_DELETE;

    // If PTR_AND_OBJ, HstPtrBegin is address of pointee
    void *TgtPtrBegin = Device.getTgtPtrBegin(HstPtrBegin, data_size, IsLast,
        UpdateRef);
    DP("There are %" PRId64 " bytes allocated at target address " DPxMOD
        " - is%s last\n", data_size, DPxPTR(TgtPtrBegin),
        (IsLast ? "" : " not"));

    bool DelEntry = IsLast || ForceDelete;

    if ((arg_types[i] & OMP_TGT_MAPTYPE_MEMBER_OF) &&
        !(arg_types[i] & OMP_TGT_MAPTYPE_PTR_AND_OBJ)) {
      DelEntry = false; // protect parent struct from being deallocated
    }

    if ((arg_types[i] & OMP_TGT_MAPTYPE_FROM) || DelEntry) {
      // Move data back to the host
      if (arg_types[i] & OMP_TGT_MAPTYPE_FROM) {
        bool Always = arg_types[i] & OMP_TGT_MAPTYPE_ALWAYS;
        bool CopyMember = false;
        if ((arg_types[i] & OMP_TGT_MAPTYPE_MEMBER_OF) &&
            !(arg_types[i] & OMP_TGT_MAPTYPE_PTR_AND_OBJ)) {
          // Copy data only if the "parent" struct has RefCount==1.
          int32_t parent_idx = member_of(arg_types[i]);
          long parent_rc = Device.getMapEntryRefCnt(args[parent_idx]);
          assert(parent_rc > 0 && "parent struct not found");
          if (parent_rc == 1) {
            CopyMember = true;
          }
        }

        if (DelEntry || Always || CopyMember) {
          DP("Moving %" PRId64 " bytes (tgt:" DPxMOD ") -> (hst:" DPxMOD ")\n",
              data_size, DPxPTR(TgtPtrBegin), DPxPTR(HstPtrBegin));
          int rt = Device.data_retrieve(HstPtrBegin, TgtPtrBegin, data_size);
          if (rt != OFFLOAD_SUCCESS) {
            DP("Copying data from device failed.\n");
            return OFFLOAD_FAIL;
          }
        }
      }

      // If we copied back to the host a struct/array containing pointers, we
      // need to restore the original host pointer values from their shadow
      // copies. If the struct is going to be deallocated, remove any remaining
      // shadow pointer entries for this struct.
      uintptr_t lb = (uintptr_t) HstPtrBegin;
      uintptr_t ub = (uintptr_t) HstPtrBegin + data_size;
      Device.ShadowMtx.lock();
      for (ShadowPtrListTy::iterator it = Device.ShadowPtrMap.begin();
           it != Device.ShadowPtrMap.end();) {
        void **ShadowHstPtrAddr = (void**) it->first;

        // An STL map is sorted on its keys; use this property
        // to quickly determine when to break out of the loop.
        if ((uintptr_t) ShadowHstPtrAddr < lb) {
          ++it;
          continue;
        }
        if ((uintptr_t) ShadowHstPtrAddr >= ub)
          break;

        // If we copied the struct to the host, we need to restore the pointer.
        if (arg_types[i] & OMP_TGT_MAPTYPE_FROM) {
          DP("Restoring original host pointer value " DPxMOD " for host "
              "pointer " DPxMOD "\n", DPxPTR(it->second.HstPtrVal),
              DPxPTR(ShadowHstPtrAddr));
          *ShadowHstPtrAddr = it->second.HstPtrVal;
        }
        // If the struct is to be deallocated, remove the shadow entry.
        if (DelEntry) {
          DP("Removing shadow pointer " DPxMOD "\n", DPxPTR(ShadowHstPtrAddr));
          it = Device.ShadowPtrMap.erase(it);
        } else {
          ++it;
        }
      }
      Device.ShadowMtx.unlock();

      // Deallocate map
      if (DelEntry) {
        int rt = Device.deallocTgtPtr(HstPtrBegin, data_size, ForceDelete);
        if (rt != OFFLOAD_SUCCESS) {
          DP("Deallocating data from device failed.\n");
          return OFFLOAD_FAIL;
        }
      }
    }
  }

  return OFFLOAD_SUCCESS;
}